

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::GeneratedMessageReflection::HasField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  int number;
  Descriptor *pDVar3;
  ExtensionSet *this_00;
  OneofDescriptor *pOVar4;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar3 = FieldDescriptor::containing_type(field);
  if (pDVar3 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"HasField","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"HasField",
               "Field is repeated; the method requires a singular field.");
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = GetExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    this_local._7_1_ = ExtensionSet::Has(this_00,number);
  }
  else {
    pOVar4 = FieldDescriptor::containing_oneof(field);
    if (pOVar4 == (OneofDescriptor *)0x0) {
      this_local._7_1_ = HasBit(this,message,field);
    }
    else {
      this_local._7_1_ = HasOneofField(this,message,field);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool GeneratedMessageReflection::HasField(const Message& message,
                                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(HasField);
  USAGE_CHECK_SINGULAR(HasField);

  if (field->is_extension()) {
    return GetExtensionSet(message).Has(field->number());
  } else {
    if (field->containing_oneof()) {
      return HasOneofField(message, field);
    } else {
      return HasBit(message, field);
    }
  }
}